

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int flow_set_properties(FLOW_HANDLE flow,fields properties_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  FLOW_INSTANCE *flow_instance;
  
  if (flow == (FLOW_HANDLE)0x0) {
    iVar2 = 0x1a6f;
  }
  else {
    item_value = amqpvalue_clone(properties_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x1a77;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(flow->composite_value,10,item_value);
      iVar2 = 0x1a7d;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int flow_set_properties(FLOW_HANDLE flow, fields properties_value)
{
    int result;

    if (flow == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow;
        AMQP_VALUE properties_amqp_value = amqpvalue_create_fields(properties_value);
        if (properties_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(flow_instance->composite_value, 10, properties_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(properties_amqp_value);
        }
    }

    return result;
}